

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

OneofOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(Arena *arena)

{
  OneofOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (OneofOptions *)operator_new(0x48);
    OneofOptions::OneofOptions(this);
  }
  else {
    AllocHook(arena,(type_info *)&OneofOptions::typeinfo,0x48);
    this = (OneofOptions *)AllocateAlignedNoHook(arena,0x48);
    OneofOptions::OneofOptions(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::OneofOptions* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::OneofOptions >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::OneofOptions >(arena);
}